

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_coin.cpp
# Opt level: O0

void __thiscall cfd::core::Txid::Txid(Txid *this,ByteData256 *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  ByteData256 *local_18;
  ByteData256 *data_local;
  Txid *this_local;
  
  this->_vptr_Txid = (_func_int **)&PTR__Txid_009eb968;
  local_18 = data;
  data_local = (ByteData256 *)this;
  ByteData256::GetBytes(&local_30,data);
  ByteData::ByteData(&this->data_,&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

Txid::Txid(const ByteData256& data) : data_(ByteData(data.GetBytes())) {
  // do nothing
}